

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjust-times.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  ostream *poVar4;
  char *pcVar5;
  uint uVar6;
  uint uVar7;
  raw_ostream *in_R9;
  timespec previous_timestamp;
  timespec time_to_set;
  timespec final_timestamp;
  string file;
  char buf_prev [64];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  InputFilenames;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  Filename;
  char buf_final [64];
  opt<bool,_false,_llvm::cl::parser<bool>_> Verbose;
  opt<bool,_false,_llvm::cl::parser<bool>_> MTimeA;
  opt<int,_false,_llvm::cl::parser<int>_> Adjust;
  alias FilenameA;
  opt<bool,_false,_llvm::cl::parser<bool>_> NowP;
  opt<bool,_false,_llvm::cl::parser<bool>_> MTimeM;
  alias VerboseA;
  alias AdjustA;
  opt<bool,_false,_llvm::cl::parser<bool>_> NowM;
  
  InputFilenames.super_Option._vptr_Option = (_func_int **)&MTimeA;
  MTimeA.super_Option._vptr_Option._0_4_ = 0;
  Filename.super_Option._vptr_Option = (_func_int **)anon_var_dwarf_6dac;
  Filename.super_Option.NumOccurrences = 0x22;
  Filename.super_Option._12_4_ = 0;
  llvm::cl::opt<int,false,llvm::cl::parser<int>>::
  opt<char[7],llvm::cl::initializer<int>,llvm::cl::desc>
            ((opt<int,false,llvm::cl::parser<int>> *)&Adjust,(char (*) [7])"adjust",
             (initializer<int> *)&InputFilenames,(desc *)&Filename);
  Filename.super_Option._vptr_Option = (_func_int **)&Adjust;
  llvm::cl::alias::alias<char[2],llvm::cl::aliasopt>
            (&AdjustA,(char (*) [2])0x162592,(aliasopt *)&Filename);
  Filename.super_Option._vptr_Option = (_func_int **)anon_var_dwarf_6df7;
  Filename.super_Option.NumOccurrences = 0x2c;
  Filename.super_Option._12_4_ = 0;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[14],llvm::cl::desc>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&MTimeA,(char (*) [14])"mtime-add-ulp",
             (desc *)&Filename);
  Filename.super_Option._vptr_Option = (_func_int **)anon_var_dwarf_6e29;
  Filename.super_Option.NumOccurrences = 0x2b;
  Filename.super_Option._12_4_ = 0;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[16],llvm::cl::desc>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&MTimeM,(char (*) [16])"mtime-minus-ulp",
             (desc *)&Filename);
  Filename.super_Option._vptr_Option = (_func_int **)anon_var_dwarf_6e5b;
  Filename.super_Option.NumOccurrences = 0x20;
  Filename.super_Option._12_4_ = 0;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[13],llvm::cl::desc>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&NowP,(char (*) [13])"now-plus-ulp",
             (desc *)&Filename);
  Filename.super_Option._vptr_Option = (_func_int **)anon_var_dwarf_6e7f;
  Filename.super_Option.NumOccurrences = 0x21;
  Filename.super_Option._12_4_ = 0;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[14],llvm::cl::desc>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&NowM,(char (*) [14])"now-minus-ulp",
             (desc *)&Filename);
  FilenameA.super_Option._vptr_Option = (_func_int **)0x15422f;
  InputFilenames.super_Option._vptr_Option = (_func_int **)anon_var_dwarf_6eca;
  InputFilenames.super_Option.NumOccurrences = 0x2b;
  InputFilenames.super_Option._12_4_ = 0;
  Verbose.super_Option._vptr_Option = (_func_int **)0x152194;
  Verbose.super_Option.NumOccurrences = 4;
  Verbose.super_Option._12_4_ = 0;
  llvm::cl::opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>>::
  opt<char[10],llvm::cl::initializer<char[1]>,llvm::cl::desc,llvm::cl::value_desc>
            ((opt<std::__cxx11::string,false,llvm::cl::parser<std::__cxx11::string>> *)&Filename,
             (char (*) [10])"from-file",(initializer<char[1]> *)&FilenameA,(desc *)&InputFilenames,
             (value_desc *)&Verbose);
  InputFilenames.super_Option._vptr_Option = (_func_int **)&Filename;
  llvm::cl::alias::alias<char[2],llvm::cl::aliasopt>
            (&FilenameA,(char (*) [2])0x1558a4,(aliasopt *)&InputFilenames);
  InputFilenames.super_Option._vptr_Option = (_func_int **)anon_var_dwarf_6f12;
  InputFilenames.super_Option.NumOccurrences = 0x17;
  InputFilenames.super_Option._12_4_ = 0;
  llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::opt<char[8],llvm::cl::desc>
            ((opt<bool,false,llvm::cl::parser<bool>> *)&Verbose,(char (*) [8])"verbose",
             (desc *)&InputFilenames);
  InputFilenames.super_Option._vptr_Option = (_func_int **)&Verbose;
  llvm::cl::alias::alias<char[2],llvm::cl::aliasopt>
            (&VerboseA,(char (*) [2])0x162e0c,(aliasopt *)&InputFilenames);
  buf_final[0] = '\x01';
  buf_final[1] = '\0';
  buf_final[2] = '\0';
  buf_final[3] = '\0';
  buf_prev._0_8_ = anon_var_dwarf_6f36;
  buf_prev[8] = '\r';
  buf_prev[9] = '\0';
  buf_prev[10] = '\0';
  buf_prev[0xb] = '\0';
  buf_prev[0xc] = '\0';
  buf_prev[0xd] = '\0';
  buf_prev[0xe] = '\0';
  buf_prev[0xf] = '\0';
  file._M_dataplus._M_p._0_4_ = 3;
  llvm::cl::list<std::__cxx11::string,bool,llvm::cl::parser<std::__cxx11::string>>::
  list<llvm::cl::FormattingFlags,llvm::cl::desc,llvm::cl::NumOccurrencesFlag>
            ((list<std::__cxx11::string,bool,llvm::cl::parser<std::__cxx11::string>> *)
             &InputFilenames,(FormattingFlags *)buf_final,(desc *)buf_prev,
             (NumOccurrencesFlag *)&file);
  llvm::cl::ParseCommandLineOptions
            ((cl *)(ulong)(uint)argc,(int)argv,(char **)"Modify timestamps of existing files\n",
             (StringRef)ZEXT816(0x24),in_R9);
  uVar6 = 4;
  if (MTimeA.super_opt_storage<bool,_false,_false>.Value == false) {
    uVar6 = (uint)MTimeM.super_opt_storage<bool,_false,_false>.Value +
            (uint)MTimeM.super_opt_storage<bool,_false,_false>.Value * 2;
  }
  uVar7 = 6;
  if (NowP.super_opt_storage<bool,_false,_false>.Value == false) {
    uVar7 = uVar6;
  }
  time_to_set.tv_sec = 0;
  time_to_set.tv_nsec = 0x3fffffff;
  uVar6 = 5;
  if (NowM.super_opt_storage<bool,_false,_false>.Value == false) {
    uVar6 = uVar7;
  }
  if (Adjust.super_opt_storage<int,_false,_false>.Value == 0) {
LAB_0010d6c1:
    if (Filename.
        super_opt_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
        .super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>._M_string_length !=
        0) {
      iVar1 = get_file_mtime(Filename.
                             super_opt_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
                             .
                             super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                             ._M_dataplus._M_p,&time_to_set);
      if (iVar1 == -1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"--from-file ");
        poVar4 = std::operator<<(poVar4,(string *)
                                        &Filename.
                                         super_opt_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_true>
                                );
        poVar4 = std::operator<<(poVar4,": ");
        piVar2 = __errno_location();
        pcVar5 = strerror(*piVar2);
        goto LAB_0010daaa;
      }
      uVar6 = 1;
    }
    if (InputFilenames.
        super_list_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
        .Storage.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        InputFilenames.
        super_list_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
        .Storage.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      llvm::cl::PrintHelpMessage(false,false);
      iVar1 = 0x40;
    }
    else {
      if (InputFilenames.
          super_list_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
          .Storage.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          InputFilenames.
          super_list_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
          .Storage.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        llvm::cl::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~list(&InputFilenames);
        llvm::cl::Option::~Option(&VerboseA.super_Option);
        llvm::cl::Option::~Option(&Verbose.super_Option);
        llvm::cl::Option::~Option(&FilenameA.super_Option);
        llvm::cl::
        opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~opt(&Filename);
        llvm::cl::Option::~Option(&NowM.super_Option);
        llvm::cl::Option::~Option(&NowP.super_Option);
        llvm::cl::Option::~Option(&MTimeM.super_Option);
        llvm::cl::Option::~Option(&MTimeA.super_Option);
        llvm::cl::Option::~Option(&AdjustA.super_Option);
        llvm::cl::Option::~Option(&Adjust.super_Option);
        return 0;
      }
      std::__cxx11::string::string
                ((string *)&file,
                 (string *)
                 InputFilenames.
                 super_list_storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
                 .Storage.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      pcVar5 = (char *)CONCAT44(file._M_dataplus._M_p._4_4_,file._M_dataplus._M_p._0_4_);
      previous_timestamp.tv_sec = 0;
      previous_timestamp.tv_nsec = 0x3ffffffe;
      if ((Verbose.super_opt_storage<bool,_false,_false>.Value != true) ||
         (iVar1 = get_file_mtime(pcVar5,&previous_timestamp), __stream = _stderr, iVar1 != -1)) {
        iVar1 = (*(code *)(&DAT_00152010 + *(int *)(&DAT_00152010 + (ulong)uVar6 * 4)))();
        return iVar1;
      }
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(__stream,"%s: %s\n",pcVar5,pcVar3);
      iVar1 = 0x42;
    }
  }
  else {
    uVar6 = Adjust.super_opt_storage<int,_false,_false>.Value - 0xf4241;
    piVar2 = __errno_location();
    if (uVar6 < 0xffe17b7f) {
      *piVar2 = 0x22;
    }
    else if (*piVar2 == 0) {
      uVar6 = 2;
      goto LAB_0010d6c1;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"--adjust ");
    poVar4 = (ostream *)
             std::ostream::operator<<(poVar4,Adjust.super_opt_storage<int,_false,_false>.Value);
    poVar4 = std::operator<<(poVar4,": ");
    pcVar5 = strerror(*piVar2);
LAB_0010daaa:
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = 0x41;
  }
  exit(iVar1);
}

Assistant:

int main(int argc, char **argv) {
  using namespace llvm;

  cl::opt<int>         Adjust   ("adjust", cl::init(0), cl::desc("Move access and modification times"));
  cl::alias            AdjustA  ("a", cl::aliasopt(Adjust));
  cl::opt<bool>        MTimeA   ("mtime-add-ulp", cl::desc("Move the a/mtime a smallest amount backwards"));
  cl::opt<bool>        MTimeM   ("mtime-minus-ulp", cl::desc("Move the a/mtime a smallest amount Forwards"));
  cl::opt<bool>        NowP     ("now-plus-ulp", cl::desc("Set to current time plus epsilon"));
  cl::opt<bool>        NowM     ("now-minus-ulp", cl::desc("Set to current time minus epsilon"));
  cl::opt<std::string> Filename ("from-file", cl::init(""), cl::desc("Set access and modification times from FILE"), cl::value_desc("file"));
  cl::alias            FilenameA("f", cl::aliasopt(Filename));
  cl::opt<bool>        Verbose  ("verbose", cl::desc("Show what is being done"));
  cl::alias            VerboseA ("v", cl::aliasopt(Verbose));
  cl::list<std::string> InputFilenames(cl::Positional, cl::desc("<Input files>"), cl::OneOrMore);

  cl::ParseCommandLineOptions(argc, argv, "Modify timestamps of existing files\n");

  enum mode {
    ModeSetToNow,
    ModeSetToFile,      // -f, --from-file
    ModeAdjustMtime,    // -a, --adjust
    ModeMtimeMinusULP,  // --mtime-minus-ulp
    ModeMtimePlusULP,   // --mtime-plus-ulp
    ModeNowMinusULP,    // --now-minus-ulp
    ModeNowPlusULP,     // --now-plus-ulp
  } mode = ModeSetToNow;

  struct timespec time_to_set = { 0, UTIME_NOW };
  double adjust_relative_sec = 0;

  if (MTimeM) {
    mode = ModeMtimeMinusULP;
  }
  if (MTimeA) {
    mode = ModeMtimePlusULP;
  }
  if (NowP) {
    mode = ModeNowPlusULP;
  }
  if (NowM) {
    mode = ModeNowMinusULP;
  }
  if (Adjust) {
    double value = Adjust;
    if (value < -1000000 || value > 1000000) {
      errno = ERANGE;
    }
    if (errno != 0) {
      std::cerr << "--adjust " << Adjust << ": " << strerror(errno) << std::endl;
      exit(EX_DATAERR);
    }
    adjust_relative_sec = value;
    mode = ModeAdjustMtime;
  }
  if (!Filename.empty()) {
    if (get_file_mtime(Filename.c_str(), &time_to_set) == -1) {
      std::cerr << "--from-file " << Filename << ": " << strerror(errno) << std::endl;
      exit(EX_DATAERR);
    }
    mode = ModeSetToFile;
  }

  // A list of filenames is required.
  if (InputFilenames.empty()) {
    cl::PrintHelpMessage();
    exit(EX_USAGE);
  }

  // Modify all files' access and modification times.
  for (std::string file : InputFilenames) {
    const char* filename = file.c_str();

    struct timespec previous_timestamp = { 0, UTIME_OMIT };
    if (Verbose) {
      if (get_file_mtime(filename, &previous_timestamp) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
    }

    switch (mode) {
    case ModeSetToNow:
    case ModeSetToFile:   // -f, --from
      if (file_time_set_fixed(filename, time_to_set) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      break;
    case ModeAdjustMtime:  // -a, --adjust
      if (file_time_adjust_relative(filename, adjust_relative_sec) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      break;
    case ModeMtimePlusULP:
    case ModeMtimeMinusULP:
      if (file_time_adjust_epsilon(filename, mode == ModeMtimeMinusULP ? -1 : 1) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      break;
    case ModeNowPlusULP:
    case ModeNowMinusULP:
      struct timespec now = { 0, UTIME_NOW };
      if (file_time_set_fixed(filename, now) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      if (file_time_adjust_epsilon(filename, mode == ModeNowMinusULP ? -1 : 1) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }
      break;
    }

    if (Verbose) {
      struct timespec final_timestamp;
      if (get_file_mtime(filename, &final_timestamp) == -1) {
        fprintf(stderr, "%s: %s\n", filename, strerror(errno));
        exit(EX_NOINPUT);
      }

      fprintf(stderr, "%s: ", filename);
      switch (mode) {
      case ModeSetToNow:
      case ModeSetToFile:
        fprintf(stderr, "reset");
        break;
      case ModeAdjustMtime:
        fprintf(stderr, "adjusted %+.9gs", adjust_relative_sec);
        break;
      case ModeMtimeMinusULP:
        fprintf(stderr, "adjusted backward");
        break;
      case ModeMtimePlusULP:
        fprintf(stderr, "adjusted forward");
        break;
      case ModeNowMinusULP:
        fprintf(stderr, "set to now - epsilon");
        break;
      case ModeNowPlusULP:
        fprintf(stderr, "set to now + epsilon");
        break;
      }

      char buf_prev[64];
      char buf_final[64];
      time_format(buf_prev, sizeof(buf_prev), previous_timestamp);
      time_format(buf_final, sizeof(buf_final), final_timestamp);

      fprintf(stderr, "\n  from %s\n  to   %s\n", buf_prev, buf_final);
    }
  }

  return 0;
}